

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_spec.cpp
# Opt level: O1

void __thiscall DLightTransfer::Serialize(DLightTransfer *this,FSerializer *arc)

{
  FSerializer *pFVar1;
  
  DObject::Serialize((DObject *)this,arc);
  pFVar1 = ::Serialize(arc,"lastlight",&this->LastLight,(int16_t *)0x0);
  pFVar1 = Serialize<sector_t>(pFVar1,"source",(sector_t_conflict **)&this->Source,
                               (sector_t_conflict **)0x0);
  pFVar1 = ::Serialize(pFVar1,"targettag",&this->TargetTag,(int32_t *)0x0);
  ::Serialize(pFVar1,"copyfloor",&this->CopyFloor,(bool *)0x0);
  return;
}

Assistant:

void DLightTransfer::Serialize(FSerializer &arc)
{
	Super::Serialize (arc);
	arc("lastlight", LastLight)
		("source", Source)
		("targettag", TargetTag)
		("copyfloor", CopyFloor);
}